

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginInitExpr
          (BinaryReaderInterp *this,FuncDesc *func)

{
  bool bVar1;
  Offset OVar2;
  reference pvVar3;
  Location local_50;
  Enum local_2c;
  Type local_28;
  Type type;
  FuncDesc *func_local;
  BinaryReaderInterp *this_local;
  
  type = (Type)func;
  std::
  vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
  ::clear(&this->label_stack_);
  this->func_ = (FuncDesc *)type;
  OVar2 = Istream::end(this->istream_);
  this->func_->code_offset = OVar2;
  pvVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                     ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)((long)type + 0x28),0);
  local_28 = *pvVar3;
  GetLocation(&local_50,this);
  local_2c = (Enum)SharedValidator::BeginInitExpr(&this->validator_,&local_50,local_28);
  bVar1 = Failed((Result)local_2c);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    PushLabel(this,Try,0xffffffff,0xffffffff,0xffffffff);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::BeginInitExpr(FuncDesc* func) {
  label_stack_.clear();
  func_ = func;
  func_->code_offset = istream_.end();
  Type type = func->type.results[0];
  CHECK_RESULT(validator_.BeginInitExpr(GetLocation(), type));
  // Push implicit init func label (equivalent to return).
  PushLabel(LabelKind::Try, Istream::kInvalidOffset, Istream::kInvalidOffset);
  return Result::Ok;
}